

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O0

void __thiscall Percentile::generateCode(Percentile *this)

{
  ulong uVar1;
  bool bVar2;
  reference ppAVar3;
  reference pvVar4;
  element_type *this_00;
  size_t sVar5;
  Application *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar6;
  ostream *poVar7;
  long in_RDI;
  ofstream ofs;
  string runFunction;
  string typeStr;
  string viewStr;
  size_t *aggID;
  size_t *viewID;
  Query *query;
  string *attName;
  size_t var;
  string printPercTensorFlow;
  string printPerc;
  string percentileComp;
  string numPercStr;
  size_t *countAggID;
  size_t *countViewID;
  Query *countQuery;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5f8;
  TreeDecomposition *in_stack_ffffffffffffe600;
  char *in_stack_ffffffffffffe610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe618;
  Attribute *in_stack_ffffffffffffe620;
  Application *in_stack_ffffffffffffe628;
  Type in_stack_ffffffffffffe634;
  undefined1 uVar8;
  string local_1990 [32];
  string local_1970 [32];
  string local_1950 [32];
  string local_1930 [32];
  ostream local_1910 [512];
  string local_1710 [32];
  string local_16f0 [32];
  string local_16d0 [32];
  string local_16b0 [32];
  string local_1690 [32];
  string local_1670 [32];
  string local_1650 [32];
  string local_1630 [32];
  string local_1610 [32];
  string local_15f0 [32];
  string local_15d0 [32];
  string local_15b0 [32];
  string local_1590 [32];
  string local_1570 [32];
  string local_1550 [32];
  string local_1530 [32];
  string local_1510 [32];
  string local_14f0 [32];
  string local_14d0 [32];
  string local_14b0 [32];
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  string local_1430 [32];
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [32];
  string local_13b0 [32];
  string local_1390 [32];
  string local_1370 [32];
  string local_1350 [32];
  string local_1330 [32];
  string local_1310 [32];
  string local_12f0 [32];
  string local_12d0 [32];
  string local_12b0 [32];
  string local_1290 [32];
  string local_1270 [32];
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  string local_11d0 [32];
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  string local_1150 [32];
  string local_1130 [32];
  string local_1110 [32];
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  unsigned_long *local_3f0;
  reference local_3e8;
  long local_3e0;
  byte local_3d1;
  reference local_3d0;
  reference local_3c0;
  string *local_3b0;
  ulong local_3a8;
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [48];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  unsigned_long *local_20;
  reference local_18;
  long local_10;
  
  local_10 = *(long *)(*(long *)(in_RDI + 0x98) + 800);
  ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                      ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)(local_10 + 0x18),0);
  local_18 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](&(*ppAVar3)->_incoming,0);
  ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                      ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)(local_10 + 0x18),0);
  pvVar4 = std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::operator[](&(*ppAVar3)->_incoming,0);
  local_20 = &pvVar4->second;
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::__cxx11::to_string((double)in_stack_ffffffffffffe5f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"",&local_371);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"",&local_399);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  local_3a8 = 0;
  while( true ) {
    uVar1 = local_3a8;
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x24ed77);
    sVar5 = TreeDecomposition::numberOfAttributes(this_00);
    if (sVar5 <= uVar1) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x24edaa);
    this_01 = (Application *)
              TreeDecomposition::getAttribute
                        (in_stack_ffffffffffffe600,(size_t)in_stack_ffffffffffffe5f8);
    local_3b0 = (string *)&this_01->_features;
    local_3d1 = 0;
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffe5f8,(size_t)in_stack_ffffffffffffe5f0);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe5f0);
    in_stack_ffffffffffffe634 = in_stack_ffffffffffffe634 & 0xffffff;
    if (bVar2) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffe5f8,(size_t)in_stack_ffffffffffffe5f0);
      local_3d1 = 1;
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe5f0);
      in_stack_ffffffffffffe634 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe634) ^ 0xff000000;
    }
    uVar8 = (undefined1)(in_stack_ffffffffffffe634 >> 0x18);
    in_stack_ffffffffffffe634 = CONCAT13(uVar8,CONCAT12(uVar8,(short)in_stack_ffffffffffffe634));
    if ((local_3d1 & 1) != 0) {
      std::bitset<100UL>::reference::~reference(&local_3d0);
    }
    std::bitset<100UL>::reference::~reference(&local_3c0);
    if ((in_stack_ffffffffffffe634 & 0x10000) == Integer) {
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::string::operator+=(local_370,local_11d0);
      std::__cxx11::string::~string(local_11d0);
      std::__cxx11::string::~string(local_11f0);
      std::__cxx11::string::~string(local_1210);
      std::__cxx11::string::~string(local_1230);
    }
    else {
      local_3e0 = *(long *)(*(long *)(in_RDI + 0x98) + local_3a8 * 8);
      in_stack_ffffffffffffe628 = (Application *)0x0;
      ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)(local_3e0 + 0x18),0
                          );
      local_3e8 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar3)->_incoming,(size_type)in_stack_ffffffffffffe628);
      ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)(local_3e0 + 0x18),
                           (size_type)in_stack_ffffffffffffe628);
      pvVar4 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar3)->_incoming,(size_type)in_stack_ffffffffffffe628);
      local_3f0 = &pvVar4->second;
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
      std::operator+((char *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::__cxx11::string::~string(local_430);
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x24ef71);
      in_stack_ffffffffffffe620 =
           TreeDecomposition::getAttribute
                     (in_stack_ffffffffffffe600,(size_t)in_stack_ffffffffffffe5f8);
      Application::typeToStr_abi_cxx11_(this_01,in_stack_ffffffffffffe634);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::string::operator+=(local_60,local_470);
      std::__cxx11::string::~string(local_470);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::~string(local_a70);
      std::__cxx11::string::~string(local_4b0);
      std::__cxx11::string::~string(local_4d0);
      std::__cxx11::string::~string(local_a50);
      std::__cxx11::string::~string(local_4f0);
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::~string(local_a30);
      std::__cxx11::string::~string(local_530);
      std::__cxx11::string::~string(local_550);
      std::__cxx11::string::~string(local_570);
      std::__cxx11::string::~string(local_590);
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::string::~string(local_5d0);
      std::__cxx11::string::~string(local_a10);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::string::~string(local_610);
      std::__cxx11::string::~string(local_9f0);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::string::~string(local_650);
      std::__cxx11::string::~string(local_9d0);
      std::__cxx11::string::~string(local_670);
      std::__cxx11::string::~string(local_690);
      std::__cxx11::string::~string(local_9b0);
      std::__cxx11::string::~string(local_6b0);
      std::__cxx11::string::~string(local_6d0);
      std::__cxx11::string::~string(local_990);
      std::__cxx11::string::~string(local_6f0);
      std::__cxx11::string::~string(local_710);
      std::__cxx11::string::~string(local_970);
      std::__cxx11::string::~string(local_730);
      std::__cxx11::string::~string(local_750);
      std::__cxx11::string::~string(local_770);
      std::__cxx11::string::~string(local_790);
      std::__cxx11::string::~string(local_7b0);
      std::__cxx11::string::~string(local_7d0);
      std::__cxx11::string::~string(local_950);
      std::__cxx11::string::~string(local_7f0);
      std::__cxx11::string::~string(local_810);
      std::__cxx11::string::~string(local_930);
      std::__cxx11::string::~string(local_830);
      std::__cxx11::string::~string(local_850);
      std::__cxx11::string::~string(local_870);
      std::__cxx11::string::~string(local_890);
      std::__cxx11::string::~string(local_8b0);
      std::__cxx11::string::~string(local_910);
      std::__cxx11::string::~string(local_8d0);
      std::__cxx11::string::~string(local_8f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::string::operator+=(local_370,local_a90);
      std::__cxx11::string::~string(local_a90);
      std::__cxx11::string::~string(local_ab0);
      std::__cxx11::string::~string(local_ad0);
      std::__cxx11::string::~string(local_af0);
      std::__cxx11::string::~string(local_df0);
      std::__cxx11::string::~string(local_b10);
      std::__cxx11::string::~string(local_b30);
      std::__cxx11::string::~string(local_b50);
      std::__cxx11::string::~string(local_b70);
      std::__cxx11::string::~string(local_dd0);
      std::__cxx11::string::~string(local_b90);
      std::__cxx11::string::~string(local_bb0);
      std::__cxx11::string::~string(local_bd0);
      std::__cxx11::string::~string(local_bf0);
      std::__cxx11::string::~string(local_c10);
      std::__cxx11::string::~string(local_c30);
      std::__cxx11::string::~string(local_c50);
      std::__cxx11::string::~string(local_db0);
      std::__cxx11::string::~string(local_c70);
      std::__cxx11::string::~string(local_c90);
      std::__cxx11::string::~string(local_d90);
      std::__cxx11::string::~string(local_cb0);
      std::__cxx11::string::~string(local_cd0);
      std::__cxx11::string::~string(local_d70);
      std::__cxx11::string::~string(local_cf0);
      std::__cxx11::string::~string(local_d10);
      std::__cxx11::string::~string(local_d30);
      std::__cxx11::string::~string(local_d50);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe628);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe620);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
      std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
      std::__cxx11::string::operator+=(local_398,local_e10);
      std::__cxx11::string::~string(local_e10);
      std::__cxx11::string::~string(local_e30);
      std::__cxx11::string::~string(local_e50);
      std::__cxx11::string::~string(local_e70);
      std::__cxx11::string::~string(local_11b0);
      std::__cxx11::string::~string(local_e90);
      std::__cxx11::string::~string(local_eb0);
      std::__cxx11::string::~string(local_ed0);
      std::__cxx11::string::~string(local_ef0);
      std::__cxx11::string::~string(local_1190);
      std::__cxx11::string::~string(local_f10);
      std::__cxx11::string::~string(local_f30);
      std::__cxx11::string::~string(local_f50);
      std::__cxx11::string::~string(local_f70);
      std::__cxx11::string::~string(local_f90);
      std::__cxx11::string::~string(local_fb0);
      std::__cxx11::string::~string(local_fd0);
      std::__cxx11::string::~string(local_1170);
      std::__cxx11::string::~string(local_ff0);
      std::__cxx11::string::~string(local_1010);
      std::__cxx11::string::~string(local_1150);
      std::__cxx11::string::~string(local_1030);
      std::__cxx11::string::~string(local_1050);
      std::__cxx11::string::~string(local_1130);
      std::__cxx11::string::~string(local_1070);
      std::__cxx11::string::~string(local_1090);
      std::__cxx11::string::~string(local_10b0);
      std::__cxx11::string::~string(local_10d0);
      std::__cxx11::string::~string(local_10f0);
      std::__cxx11::string::~string(local_1110);
      std::__cxx11::string::~string(local_450);
      std::__cxx11::string::~string(local_410);
    }
    local_3a8 = local_3a8 + 1;
  }
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  std::__cxx11::string::~string(local_1270);
  std::__cxx11::string::~string(local_1710);
  std::__cxx11::string::~string(local_1290);
  std::__cxx11::string::~string(local_12b0);
  std::__cxx11::string::~string(local_16f0);
  std::__cxx11::string::~string(local_12d0);
  std::__cxx11::string::~string(local_12f0);
  std::__cxx11::string::~string(local_1310);
  std::__cxx11::string::~string(local_16d0);
  std::__cxx11::string::~string(local_1330);
  std::__cxx11::string::~string(local_1350);
  std::__cxx11::string::~string(local_16b0);
  std::__cxx11::string::~string(local_1370);
  std::__cxx11::string::~string(local_1390);
  std::__cxx11::string::~string(local_1690);
  std::__cxx11::string::~string(local_13b0);
  std::__cxx11::string::~string(local_13d0);
  std::__cxx11::string::~string(local_13f0);
  std::__cxx11::string::~string(local_1670);
  std::__cxx11::string::~string(local_1410);
  std::__cxx11::string::~string(local_1430);
  std::__cxx11::string::~string(local_1450);
  std::__cxx11::string::~string(local_1650);
  std::__cxx11::string::~string(local_1470);
  std::__cxx11::string::~string(local_1490);
  std::__cxx11::string::~string(local_14b0);
  std::__cxx11::string::~string(local_1630);
  std::__cxx11::string::~string(local_14d0);
  std::__cxx11::string::~string(local_14f0);
  std::__cxx11::string::~string(local_1510);
  std::__cxx11::string::~string(local_1530);
  std::__cxx11::string::~string(local_1550);
  std::__cxx11::string::~string(local_1610);
  std::__cxx11::string::~string(local_1570);
  std::__cxx11::string::~string(local_1590);
  std::__cxx11::string::~string(local_15f0);
  std::__cxx11::string::~string(local_15b0);
  std::__cxx11::string::~string(local_15d0);
  std::operator+(in_stack_ffffffffffffe618,in_stack_ffffffffffffe610);
  std::ofstream::ofstream(local_1910,local_1930,_S_out);
  std::__cxx11::string::~string(local_1930);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(local_1910,"#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n");
  poVar6 = std::operator<<((ostream *)__lhs,"#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n");
  poVar7 = std::operator<<(poVar6,"#include \"DataHandler.h\"\n\n");
  poVar7 = std::operator<<(poVar7,"namespace lmfao\n{\n");
  Application::offset_abi_cxx11_(in_stack_ffffffffffffe628,(size_t)in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f8,(char *)in_stack_ffffffffffffe5f0);
  poVar7 = std::operator<<(poVar7,local_1950);
  std::operator<<(poVar7,"}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n");
  std::__cxx11::string::~string(local_1950);
  std::__cxx11::string::~string(local_1970);
  std::ofstream::close();
  std::operator+(__lhs,(char *)poVar6);
  std::ofstream::open((string *)local_1910,(_Ios_Openmode)local_1990);
  std::__cxx11::string::~string(local_1990);
  poVar6 = std::operator<<(local_1910,"#include \"ApplicationHandler.h\"\n");
  std::operator<<(poVar6,"namespace lmfao\n{\n");
  poVar6 = std::operator<<(local_1910,local_1250);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_1910,"}\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_1910);
  std::__cxx11::string::~string(local_1250);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Percentile::generateCode()
{
    Query* countQuery = varToQuery[NUM_OF_VARIABLES];
    size_t& countViewID = countQuery->_aggregates[0]->_incoming[0].first;
    size_t& countAggID = countQuery->_aggregates[0]->_incoming[0].second;

    std::string numPercStr = to_string(numberOfPercentiles);

    std::string percentileComp =
        // offset(1)+"void computePercentiles()\n"+offset(1)+"{\n"+
        offset(2)+"size_t tupleCount = (size_t)V"+to_string(countViewID)+
        "[0].aggregates["+to_string(countAggID)+"], offset = 0, pIndex = 0;\n"+
        offset(2)+"size_t percentileCounts["+numPercStr+"];\n"+
        offset(2)+"for (size_t i = 1; i < "+numPercStr+"; i++)\n"+
        offset(3)+"percentileCounts[i-1] = ceil("+
        to_string(100.0/(numberOfPercentiles*100))+"*i*tupleCount);\n\n";

    std::string printPerc = "", printPercTensorFlow = "";
    
    // Create a query & Aggregate
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        std::string& attName =  _td->getAttribute(var)->_name;

        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Query* query = varToQuery[var];
            const size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            const size_t& aggID = query->_aggregates[0]->_incoming[0].second;

            std::string viewStr = "V"+to_string(viewID);
            std::string typeStr = typeToStr(_td->getAttribute(var)->_type);
            
            percentileComp += offset(2)+"offset = 0; pIndex = 0;\n"+
                offset(2)+typeStr+" percentiles"+attName+"["+
                to_string(numberOfPercentiles-1)+"];\n"+
                offset(2)+"for ("+viewStr+"_tuple& tuple : "+viewStr+")\n"+
                offset(2)+"{\n"+
                offset(3)+"offset += tuple.aggregates["+to_string(aggID)+"];\n"+
                offset(3)+"while(offset >= percentileCounts[pIndex])\n"+offset(3)+"{\n"+
                offset(4)+"percentiles"+attName+"[pIndex] = tuple."+attName+";\n"+
                offset(4)+"++pIndex;\n"+offset(3)+"}\n"+
                offset(2)+"}\n\n";

            printPerc += offset(2)+"std::cout << \"{\"<<percentiles"+attName+"[0];\n"+
                offset(2)+"for (size_t p = 1; p < "+
                to_string(numberOfPercentiles-1)+"; ++p)\n"+
                offset(3)+"if (percentiles"+attName+"[p] != "+
                "percentiles"+attName+"[p-1])\n"+
                offset(4)+"std::cout << \",\" << percentiles"+attName+"[p];\n"+
                offset(2)+"std::cout << \"},// percentiles "+attName+"\"<< std::endl;\n";

            // 
            printPercTensorFlow += offset(2)+"std::cout << \"\'"+attName+"\': \" << \"[\"<<percentiles"+attName+"[0];\n"+
                offset(2)+"for (size_t p = 1; p < "+
                to_string(numberOfPercentiles-1)+"; ++p)\n"+
                offset(3)+"if (percentiles"+attName+"[p] != "+
                "percentiles"+attName+"[p-1])\n"+
                offset(4)+"std::cout << \",\" << percentiles"+attName+"[p];\n"+
                offset(2)+"std::cout << \"],  ## percentiles "+attName+"\"<< std::endl;\n";
        }
        else
        {
            printPerc += offset(2)+"std::cout << \"{},// percentiles "+attName+
                "\"<<std::endl;\n";
        }
    }
    // percentileComp += printPerc+offset(1)+"}\n\n";
    
    std::string runFunction = offset(1)+"void runApplication()\n"+offset(1)+"{\n"+
        offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n"+percentileComp+
        "\n"+offset(2)+"int64_t endProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Run Application: \"+"+
        "std::to_string(endProcess)+\"ms.\\n\";\n\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << endProcess << std::endl;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+"std::cout << \"_thresholds = {\\n\";"+
        printPerc+
        // printPercTensorFlow+ // uncomment this for the percentiles used for tensorflow
        offset(2)+"std::cout << \"};\\n\";"+
        offset(1)+"}\n";
        
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n"<<
        "#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n"<<
        "#include \"DataHandler.h\"\n\n"<<
        "namespace lmfao\n{\n"<<
        offset(1)+"void runApplication();\n"<<
        "}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.cpp", std::ofstream::out);
    ofs << "#include \"ApplicationHandler.h\"\n"
        << "namespace lmfao\n{\n";
    ofs << runFunction << std::endl;
    ofs << "}\n";
    ofs.close();
    
}